

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

bool parse_line_json<true>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  example *local_70;
  DecisionServiceInteraction interaction;
  
  if (all->p->decision_service_json == true) {
    if (*line == '{') {
      interaction.eventId._M_dataplus._M_p = (pointer)&interaction.eventId.field_2;
      interaction.eventId._M_string_length = 0;
      interaction.eventId.field_2._M_local_buf[0] = '\0';
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
      interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      interaction.probabilityOfDrop = 0.0;
      interaction.skipLearn = false;
      VW::read_line_decision_service_json<true>
                (all,examples,line,num_chars,false,VW::get_unused_example,all,&interaction);
      puVar2 = interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar1 = interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (interaction.skipLearn == true) {
        VW::return_multiple_example(all,examples);
        local_70 = VW::get_unused_example(all);
        v_array<example_*>::push_back(examples,&local_70);
        DecisionServiceInteraction::~DecisionServiceInteraction(&interaction);
      }
      else {
        DecisionServiceInteraction::~DecisionServiceInteraction(&interaction);
        if (puVar2 != puVar1) goto LAB_001daf43;
      }
    }
    bVar3 = false;
  }
  else {
    VW::read_line_json<true>(all,examples,line,VW::get_unused_example,all);
LAB_001daf43:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool parse_line_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  if (all->p->decision_service_json)
  {
    // Skip lines that do not start with "{"
    if (line[0] != '{')
    {
      return false;
    }

    DecisionServiceInteraction interaction;
    VW::template read_line_decision_service_json<audit>(*all, examples, line, num_chars, false,
        reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all, &interaction);

    // TODO: In refactoring the parser to be usable standalone, we need to ensure that we
    // stop suppressing "skipLearn" interactions. Also, not sure if this is the right logic
    // for counterfactual. (@marco)
    if (interaction.skipLearn)
    {
      VW::return_multiple_example(*all, examples);
      examples.push_back(&VW::get_unused_example(all));
      return false;
    }

    // let's ask to continue reading data until we find a line with actions provided
    if (interaction.actions.size() == 0)
    {
      //VW::return_multiple_example(*all, examples);
      //examples.push_back(&VW::get_unused_example(all));
      return false;
    }
  }
  else
    VW::template read_line_json<audit>(
        *all, examples, line, reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all);

  return true;
}